

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::AddJumpOffset
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelId,uint fieldByteOffsetFromEnd)

{
  Type *pTVar1;
  uint uVar2;
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  code *pcVar4;
  bool bVar5;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  undefined4 *puVar6;
  Type *pTVar7;
  int iVar8;
  JumpInfo JVar9;
  JumpInfo JVar10;
  int iVar11;
  uint uVar12;
  
  if (99 < fieldByteOffsetFromEnd) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xa8e,"(fieldByteOffsetFromEnd < 100)","Ensure valid field offset")
    ;
    if (!bVar5) goto LAB_0089cc8f;
    *puVar6 = 0;
  }
  CheckOpen(this);
  CheckLabel(this,labelId);
  uVar12 = (this->m_byteCodeData).currentOffset - fieldByteOffsetFromEnd;
  if (this->useBranchIsland == true) {
    this->nextBranchIslandOffset = this->nextBranchIslandOffset + -7;
    pTVar7 = JsUtil::
             List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this->m_labelOffsets,labelId);
    uVar2 = *pTVar7;
    if (uVar2 != 0xffffffff) {
      if ((this->m_byteCodeData).currentOffset <= uVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0xa9f,"(labelOffset < m_byteCodeData.GetCurrentOffset())",
                                    "labelOffset < m_byteCodeData.GetCurrentOffset()");
        if (!bVar5) {
LAB_0089cc8f:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar6 = 0;
      }
      iVar11 = uVar2 - (this->m_byteCodeData).currentOffset;
      bVar5 = ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Configuration::Global,ByteCodeBranchLimitFlag);
      iVar8 = 0x8000;
      if (bVar5) {
        iVar8 = 0x40;
        if (0x40 < DAT_015b5fb8) {
          iVar8 = DAT_015b5fb8;
        }
        if (0x7fff < iVar8) {
          iVar8 = 0x8000;
        }
      }
      if (SBORROW4(iVar11,-iVar8) != iVar11 + iVar8 < 0) {
        labelID = DefineLabel(this);
        pLVar3 = this->m_jumpOffsets;
        JsUtil::
        List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(pLVar3,0);
        JVar9.patchOffset = uVar12;
        JVar9.labelId = labelID;
        (pLVar3->
        super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>).
        buffer[(pLVar3->
               super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
               ).count] = JVar9;
        pTVar1 = &(pLVar3->
                  super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count;
        *pTVar1 = *pTVar1 + 1;
        bVar5 = OpCodeAttr::HasFallThrough(op);
        labelID_00 = -1;
        if (bVar5) {
          labelID_00 = DefineLabel(this);
          Br(this,Br,labelID_00);
        }
        MarkLabel(this,labelID);
        BrLong(this,BrLong,labelId);
        if (labelID_00 == -1) {
          return;
        }
        MarkLabel(this,labelID_00);
        return;
      }
    }
  }
  pLVar3 = this->m_jumpOffsets;
  JsUtil::
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(pLVar3,0);
  JVar10.patchOffset = uVar12;
  JVar10.labelId = labelId;
  (pLVar3->super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
  ).buffer[(pLVar3->
           super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
           ).count] = JVar10;
  pTVar1 = &(pLVar3->
            super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
  *pTVar1 = *pTVar1 + 1;
  return;
}

Assistant:

void ByteCodeWriter::AddJumpOffset(Js::OpCode op, ByteCodeLabel labelId, uint fieldByteOffsetFromEnd) // Offset of "Offset" field in OpLayout, in bytes
    {
        AssertMsg(fieldByteOffsetFromEnd < 100, "Ensure valid field offset");
        CheckOpen();
        CheckLabel(labelId);

        uint jumpByteOffset = m_byteCodeData.GetCurrentOffset() - fieldByteOffsetFromEnd;
#ifdef BYTECODE_BRANCH_ISLAND
        if (useBranchIsland)
        {
            // Any Jump might need a long jump, account for that emit the branch island earlier.
            // Even if it is a back edge and we are going to emit a long jump, we will still
            // emit a branch around any way.
            this->nextBranchIslandOffset -= LongBranchSize;

            uint labelOffset = m_labelOffsets->Item(labelId);
            if (labelOffset != UINT_MAX)
            {
                // Back branch, see if it needs to be long
                Assert(labelOffset < m_byteCodeData.GetCurrentOffset());
                LongJumpOffset jumpOffset = labelOffset - m_byteCodeData.GetCurrentOffset();
                if (jumpOffset < -GetBranchLimit())
                {
                    // Create the long jump label and add the original jump offset to the list first
                    ByteCodeLabel longJumpLabel = this->DefineLabel();
                    JumpInfo jumpInfo = { longJumpLabel, jumpByteOffset };
                    m_jumpOffsets->Add(jumpInfo);

                    // Emit the jump around (if necessary)
                    ByteCodeLabel jumpAroundLabel = (ByteCodeLabel)-1;
                    if (OpCodeAttr::HasFallThrough(op))
                    {
                        // emit jump around.
                        jumpAroundLabel = this->DefineLabel();
                        this->Br(jumpAroundLabel);
                    }

                    // emit the long jump
                    this->MarkLabel(longJumpLabel);
                    this->BrLong(Js::OpCode::BrLong, labelId);

                    if (jumpAroundLabel != (ByteCodeLabel)-1)
                    {
                        this->MarkLabel(jumpAroundLabel);
                    }
                    return;
                }
            }
        }
#endif
        //
        // Branch targets are created in two passes:
        // - In the instruction stream, write "labelID" into "OpLayoutBrC.Offset".  Record this
        //   location in "m_jumpOffsets" to be patched later.
        // - When the byte-code is closed, update all "OpLayoutBrC.Offset"'s with their actual
        //   destinations.
        //

        JumpInfo jumpInfo = { labelId, jumpByteOffset };
        m_jumpOffsets->Add(jumpInfo);
    }